

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall Test_aistr_compare_Test::TestBody(Test_aistr_compare_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  AssertionResult gtest_ar;
  char buf [10];
  AssertHelper local_48;
  AssertHelper local_40;
  Message local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  byte local_28 [16];
  
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::checkPointerNotNull((char *)0x0);
  }
  testing::Message::Message(&local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x56,
             "Expected: ai::compare(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,local_38.ss_.ptr_._0_1_) + 8))();
    }
  }
  ai::checkPointerNotNull("1234");
  sVar2 = ai::length("1234",9);
  sVar4 = 9;
  if (sVar2 < 9) {
    sVar4 = sVar2;
  }
  memcpy(local_28,"1234",sVar4);
  local_28[sVar4] = 0;
  ai::checkPointerNotNull("1234");
  local_48.data_._0_4_ = strncmp((char *)local_28,"1234",10);
  local_40.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"ai::compare(buf, \"1234\")","0",(int *)&local_48,
             (int *)&local_40);
  if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ai::checkPointerNotNull("1234 ");
    local_48.data_._0_4_ = strncmp((char *)local_28,"1234 ",10);
    local_40.data_._0_4_ = 0;
    testing::internal::CmpHelperNE<int,int>
              ((internal *)&local_38,"ai::compare(buf, \"1234 \")","0",(int *)&local_48,
               (int *)&local_40);
    if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x5a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      ai::checkPointerNotNull(" 1234");
      local_48.data_._0_4_ = strncmp((char *)local_28," 1234",10);
      local_40.data_._0_4_ = 0;
      testing::internal::CmpHelperNE<int,int>
                ((internal *)&local_38,"ai::compare(buf, \" 1234\")","0",(int *)&local_48,
                 (int *)&local_40);
      if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_30.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x5b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        ai::checkPointerNotNull("1234");
        local_48.data_._0_4_ = strncmp((char *)local_28,"1234",10);
        local_40.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_38,"ai::compare(buf, \"1234\\0\")","0",(int *)&local_48,
                   (int *)&local_40);
        if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_48);
          if (local_30.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x5c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          pcVar3 = "";
          ai::checkPointerNotNull("");
          sVar2 = ai::length("",9);
          sVar4 = 9;
          if (sVar2 < 9) {
            sVar4 = sVar2;
          }
          memset(local_28,0,sVar4);
          local_28[sVar4] = 0;
          ai::checkPointerNotNull("");
          local_48.data_._0_4_ = (uint)local_28[0];
          local_40.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_38,"ai::compare(buf, \"\")","0",(int *)&local_48,
                     (int *)&local_40);
          if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (local_30.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x5f,pcVar3);
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper(&local_40);
            if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_30,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_30,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            ai::checkPointerNotNull("123456789");
            sVar2 = ai::length("123456789",9);
            sVar4 = 9;
            if (sVar2 < 9) {
              sVar4 = sVar2;
            }
            memcpy(local_28,"123456789",sVar4);
            local_28[sVar4] = 0;
            ai::checkPointerNotNull("123456789");
            local_48.data_._0_4_ = strncmp((char *)local_28,"123456789",10);
            local_40.data_._0_4_ = 0;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_38,"ai::compare(buf, \"123456789\")","0",(int *)&local_48,
                       (int *)&local_40);
            if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_48);
              if (local_30.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_40,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                         ,0x62,pcVar3);
              testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
              testing::internal::AssertHelper::~AssertHelper(&local_40);
              if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_30,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_30,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              ai::checkPointerNotNull("12345678901");
              sVar2 = ai::length("12345678901",9);
              sVar4 = 9;
              if (sVar2 < 9) {
                sVar4 = sVar2;
              }
              memcpy(local_28,"12345678901",sVar4);
              local_28[sVar4] = 0;
              ai::checkPointerNotNull("123456789");
              local_48.data_._0_4_ = strncmp((char *)local_28,"123456789",10);
              local_40.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_38,"ai::compare(buf, \"123456789\")","0",
                         (int *)&local_48,(int *)&local_40);
              if (local_38.ss_.ptr_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_48);
                if (local_30.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_40,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                           ,0x65,pcVar3);
                testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
                testing::internal::AssertHelper::~AssertHelper(&local_40);
                if (CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(uint)local_48.data_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_30,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, compare) {
    char buf[10] = {0};

    EXPECT_THROW(ai::compare(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);
    ASSERT_NE(ai::compare(buf, "1234 "), 0);
    ASSERT_NE(ai::compare(buf, " 1234"), 0);
    ASSERT_EQ(ai::compare(buf, "1234\0"), 0);

    ai::assign(buf, "");
    ASSERT_EQ(ai::compare(buf, ""), 0);

    ai::assign(buf, "123456789");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::assign(buf, "12345678901");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}